

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DynamicObject.cpp
# Opt level: O0

bool __thiscall Js::DynamicObject::IsCompatibleForCopy(DynamicObject *this,DynamicObject *from)

{
  bool bVar1;
  uint16 uVar2;
  uint16 uVar3;
  uint uVar4;
  BOOL BVar5;
  DynamicTypeHandler *pDVar6;
  RecyclableObject *pRVar7;
  RecyclableObject *pRVar8;
  ScriptContext *pSVar9;
  ScriptContext *pSVar10;
  DynamicObject *from_local;
  DynamicObject *this_local;
  
  pDVar6 = GetTypeHandler(this);
  uVar2 = DynamicTypeHandler::GetInlineSlotCapacity(pDVar6);
  pDVar6 = GetTypeHandler(from);
  uVar3 = DynamicTypeHandler::GetInlineSlotCapacity(pDVar6);
  if (uVar2 == uVar3) {
    pDVar6 = GetTypeHandler(from);
    uVar4 = (*pDVar6->_vptr_DynamicTypeHandler[0x51])();
    if ((uVar4 & 1) == 0) {
      bVar1 = Phases::IsEnabled((Phases *)&DAT_01ec1678,ObjectCopyPhase);
      if (bVar1) {
        Output::Print(L"ObjectCopy: Can\'t copy: from obj does not have copyable type handler\n");
      }
      this_local._7_1_ = false;
    }
    else {
      bVar1 = HasObjectArray(this);
      if (bVar1) {
        bVar1 = Phases::IsEnabled((Phases *)&DAT_01ec1678,ObjectCopyPhase);
        if (bVar1) {
          Output::Print(L"ObjectCopy: Can\'t copy: to obj has object array\n");
        }
        this_local._7_1_ = false;
      }
      else {
        uVar2 = GetOffsetOfInlineSlots(from);
        uVar3 = GetOffsetOfInlineSlots(this);
        if (uVar2 == uVar3) {
          pRVar7 = RecyclableObject::GetPrototype(&this->super_RecyclableObject);
          pRVar8 = RecyclableObject::GetPrototype(&from->super_RecyclableObject);
          if (pRVar7 == pRVar8) {
            BVar5 = RecyclableObject::IsExternal(&from->super_RecyclableObject);
            if (BVar5 == 0) {
              pSVar9 = RecyclableObject::GetScriptContext(&this->super_RecyclableObject);
              pSVar10 = RecyclableObject::GetScriptContext(&from->super_RecyclableObject);
              if (pSVar9 == pSVar10) {
                this_local._7_1_ = true;
              }
              else {
                bVar1 = Phases::IsEnabled((Phases *)&DAT_01ec1678,ObjectCopyPhase);
                if (bVar1) {
                  Output::Print(
                               L"ObjectCopy: Can\'t copy: from obj is from different ScriptContext\n"
                               );
                }
                this_local._7_1_ = false;
              }
            }
            else {
              bVar1 = Phases::IsEnabled((Phases *)&DAT_01ec1678,ObjectCopyPhase);
              if (bVar1) {
                Output::Print(L"ObjectCopy: Can\'t copy: from obj is External\n");
              }
              this_local._7_1_ = false;
            }
          }
          else {
            bVar1 = Phases::IsEnabled((Phases *)&DAT_01ec1678,ObjectCopyPhase);
            if (bVar1) {
              Output::Print(L"ObjectCopy: Can\'t copy: Prototypes don\'t match\n");
            }
            this_local._7_1_ = false;
          }
        }
        else {
          bVar1 = Phases::IsEnabled((Phases *)&DAT_01ec1678,ObjectCopyPhase);
          if (bVar1) {
            Output::Print(L"ObjectCopy: Can\'t copy: Don\'t have same inline slot offset\n");
          }
          this_local._7_1_ = false;
        }
      }
    }
  }
  else {
    bVar1 = Phases::IsEnabled((Phases *)&DAT_01ec1678,ObjectCopyPhase);
    if (bVar1) {
      pDVar6 = GetTypeHandler(from);
      uVar2 = DynamicTypeHandler::GetInlineSlotCapacity(pDVar6);
      pDVar6 = GetTypeHandler(this);
      uVar3 = DynamicTypeHandler::GetInlineSlotCapacity(pDVar6);
      Output::Print(L"ObjectCopy: Can\'t copy: inline slot capacity doesn\'t match, from: %u, to: %u\n"
                    ,(ulong)uVar2,(ulong)uVar3);
    }
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool DynamicObject::IsCompatibleForCopy(DynamicObject* from) const
    {
        if (this->GetTypeHandler()->GetInlineSlotCapacity() != from->GetTypeHandler()->GetInlineSlotCapacity())
        {
            if (PHASE_TRACE1(ObjectCopyPhase))
            {
                Output::Print(_u("ObjectCopy: Can't copy: inline slot capacity doesn't match, from: %u, to: %u\n"),
                    from->GetTypeHandler()->GetInlineSlotCapacity(),
                    this->GetTypeHandler()->GetInlineSlotCapacity());
            }
            return false;
        }
        if (!from->GetTypeHandler()->IsObjectCopyable())
        {
            if (PHASE_TRACE1(ObjectCopyPhase))
            {
                Output::Print(_u("ObjectCopy: Can't copy: from obj does not have copyable type handler\n"));
            }
            return false;
        }
        if (this->HasObjectArray())
        {
            if (PHASE_TRACE1(ObjectCopyPhase))
            {
                Output::Print(_u("ObjectCopy: Can't copy: to obj has object array\n"));
            }
            return false;
        }
        if (from->GetOffsetOfInlineSlots() != this->GetOffsetOfInlineSlots())
        {
            if (PHASE_TRACE1(ObjectCopyPhase))
            {
                Output::Print(_u("ObjectCopy: Can't copy: Don't have same inline slot offset\n"));
            }
            return false;
        }
        if (this->GetPrototype() != from->GetPrototype())
        {
            if (PHASE_TRACE1(ObjectCopyPhase))
            {
                Output::Print(_u("ObjectCopy: Can't copy: Prototypes don't match\n"));
            }
            return false;
        }
        if (from->IsExternal())
        {
            if (PHASE_TRACE1(ObjectCopyPhase))
            {
                Output::Print(_u("ObjectCopy: Can't copy: from obj is External\n"));
            }
            return false;
        }
        if (this->GetScriptContext() != from->GetScriptContext())
        {
            if (PHASE_TRACE1(ObjectCopyPhase))
            {
                Output::Print(_u("ObjectCopy: Can't copy: from obj is from different ScriptContext\n"));
            }
            return false;
        }

        return true;
    }